

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void frstage(float *ioptr,long M,float *Utbl)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  char cVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  float Two;
  float t1i;
  float t1r;
  float t0i;
  float t0r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float w0i;
  float w0r;
  float *u0i;
  float *u0r;
  float *p1r;
  float *p0r;
  unsigned_long diffUcnt;
  unsigned_long posi;
  unsigned_long pos;
  float *Utbl_local;
  
  cVar10 = (char)M;
  uVar11 = 1L << (cVar10 - 1U & 0x3f);
  lVar12 = uVar11 + 1;
  pfVar13 = ioptr + (uVar11 >> 1);
  fVar1 = Utbl[1L << (cVar10 - 3U & 0x3f)];
  fVar2 = *ioptr;
  fVar3 = ioptr[uVar11];
  fVar4 = ioptr[lVar12];
  fVar5 = *pfVar13 + pfVar13[uVar11];
  fVar8 = pfVar13[1] - pfVar13[lVar12];
  fVar6 = pfVar13[1] + pfVar13[lVar12];
  fVar9 = pfVar13[uVar11] - *pfVar13;
  fVar7 = fVar5 + fVar1 * fVar6 + fVar1 * fVar9;
  fVar1 = (fVar8 - fVar1 * fVar6) + fVar1 * fVar9;
  *ioptr = fVar2 * 2.0 + ioptr[1] * 2.0;
  ioptr[1] = fVar2 * 2.0 - ioptr[1] * 2.0;
  ioptr[uVar11] = fVar3 + fVar3;
  ioptr[lVar12] = -fVar4 - fVar4;
  *pfVar13 = fVar7;
  pfVar13[1] = fVar1;
  pfVar13[uVar11] = fVar5 * 2.0 - fVar7;
  pfVar13[lVar12] = fVar1 - fVar8 * 2.0;
  f1r = Utbl[1];
  f1i = Utbl[(1L << (cVar10 - 2U & 0x3f)) + -1];
  u0r = ioptr + 2;
  u0i = ioptr + ((1L << (cVar10 - 2U & 0x3f)) + -1) * 2;
  p1r = (float *)(1L << (cVar10 - 3U & 0x3f));
  _f0i = Utbl + (1L << (cVar10 - 2U & 0x3f)) + -1;
  _w0i = Utbl + 1;
  while (p1r = (float *)((long)p1r + -1), p1r != (float *)0x0) {
    fVar1 = *u0r + u0i[uVar11];
    fVar7 = u0r[1] - u0i[lVar12];
    fVar2 = u0r[1] + u0i[lVar12];
    fVar4 = u0i[uVar11] - *u0r;
    fVar3 = fVar1 + f1r * fVar2 + f1i * fVar4;
    fVar2 = (fVar7 - f1i * fVar2) + f1r * fVar4;
    fVar4 = *u0i + u0r[uVar11];
    fVar8 = u0i[1] - u0r[lVar12];
    fVar5 = u0i[1] + u0r[lVar12];
    fVar9 = u0r[uVar11] - *u0i;
    fVar6 = fVar4 + f1i * fVar5 + f1r * fVar9;
    fVar5 = (fVar8 - f1r * fVar5) + f1i * fVar9;
    *u0r = fVar3;
    u0r[1] = fVar2;
    u0i[uVar11] = fVar1 * 2.0 - fVar3;
    u0i[lVar12] = fVar2 - fVar7 * 2.0;
    f1r = _w0i[1];
    f1i = _f0i[-1];
    *u0i = fVar6;
    u0i[1] = fVar5;
    u0r[uVar11] = fVar4 * 2.0 - fVar6;
    u0r[lVar12] = fVar5 - fVar8 * 2.0;
    u0r = u0r + 2;
    u0i = u0i + -2;
    _f0i = _f0i + -1;
    _w0i = _w0i + 1;
  }
  return;
}

Assistant:

static inline void frstage(float *ioptr, long M, float *Utbl){
/*	Finish RFFT		*/

unsigned long 	pos;
unsigned long 	posi;
unsigned long 	diffUcnt;

float 	*p0r, *p1r;
float 	*u0r, *u0i;

float w0r, w0i;
float f0r, f0i, f1r, f1i, f4r, f4i, f5r, f5i;
float t0r, t0i, t1r, t1i;
const float Two = 2.0;

pos = POW2(M-1);
posi = pos + 1;

p0r = ioptr;
p1r = ioptr + pos/2;

u0r = Utbl + POW2(M-3);

w0r =  *u0r,

f0r = *(p0r);
f0i = *(p0r + 1);
f4r = *(p0r + pos);
f4i = *(p0r + posi);
f1r = *(p1r);
f1i = *(p1r + 1);
f5r = *(p1r + pos);
f5i = *(p1r + posi);

	t0r = Two * f0r + Two * f0i;    /* compute Re(x[0]) */
	t0i = Two * f0r - Two * f0i;    /* compute Re(x[N/2]) */
	t1r = f4r + f4r;
	t1i = -f4i - f4i;

	f0r = f1r + f5r;
	f0i = f1i - f5i;
	f4r = f1i + f5i;
	f4i = f5r - f1r;

	f1r = f0r + w0r * f4r + w0r * f4i;
	f1i = f0i - w0r * f4r + w0r * f4i;
	f5r = Two * f0r - f1r;
	f5i = f1i - Two * f0i;

*(p0r) = t0r;
*(p0r + 1) = t0i;
*(p0r + pos) = t1r;
*(p0r + posi) = t1i;
*(p1r) = f1r;
*(p1r + 1) = f1i;
*(p1r + pos) = f5r;
*(p1r + posi) = f5i;

u0r = Utbl + 1;
u0i = Utbl + (POW2(M-2)-1);

w0r =  *u0r,
w0i =  *u0i;
	
p0r = (ioptr + 2);
p1r = (ioptr + (POW2(M-2)-1)*2);

				/* Butterflys */
				/*
		f0	-	t0	-	-	f0
		f5	-	t1	- w0	-	f5

		f1	-	t0	-	-	f1
		f4	-	t1	-iw0 -	f4
				*/

for (diffUcnt = POW2(M-3)-1; diffUcnt > 0 ; diffUcnt--){

	f0r = *(p0r);
	f0i = *(p0r + 1);
	f5r = *(p1r + pos);
	f5i = *(p1r + posi);
	f1r = *(p1r);
	f1i = *(p1r + 1);
	f4r = *(p0r + pos);
	f4i = *(p0r + posi);

	t0r = f0r + f5r;
	t0i = f0i - f5i;
	t1r = f0i + f5i;
	t1i = f5r - f0r;

	f0r = t0r + w0r * t1r + w0i * t1i;
	f0i = t0i - w0i * t1r + w0r * t1i;
	f5r = Two * t0r - f0r;
	f5i = f0i - Two * t0i;

	t0r = f1r + f4r;
	t0i = f1i - f4i;
	t1r = f1i + f4i;
	t1i = f4r - f1r;

	f1r = t0r + w0i * t1r + w0r * t1i;
	f1i = t0i - w0r * t1r + w0i * t1i;
	f4r = Two * t0r - f1r;
	f4i = f1i - Two * t0i;

	*(p0r) = f0r;
	*(p0r + 1) = f0i;
	*(p1r + pos) = f5r;
	*(p1r + posi) = f5i;

	w0r = *++u0r;
	w0i = *--u0i;

	*(p1r) = f1r;
	*(p1r + 1) = f1i;
	*(p0r + pos) = f4r;
	*(p0r + posi) = f4i;

	p0r += 2;
	p1r -= 2;
};
}